

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::PopGTestTrace(UnitTest *this)

{
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *this_00;
  GTestMutexLock local_11;
  UnitTest *pUStack_10;
  MutexLock lock;
  UnitTest *this_local;
  
  pUStack_10 = this;
  internal::GTestMutexLock::GTestMutexLock(&local_11,(Mutex *)&this->field_0x8);
  this_00 = internal::UnitTestImpl::gtest_trace_stack(this->impl_);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::pop_back
            (this_00);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().pop_back();
}